

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph.cpp
# Opt level: O2

Node * __thiscall
spoa::Graph::BranchCompletion
          (Graph *this,uint32_t rank,vector<long,_std::allocator<long>_> *scores,
          vector<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_> *predecessors)

{
  long *plVar1;
  uint uVar2;
  pointer ppEVar3;
  pointer ppEVar4;
  Node *pNVar5;
  pointer plVar6;
  Node *pNVar7;
  long lVar8;
  Node *pNVar9;
  ulong uVar10;
  pointer ppNVar11;
  Edge **it;
  pointer ppEVar12;
  Edge **jt_1;
  Edge **jt;
  pointer ppEVar13;
  
  uVar10 = (ulong)rank;
  ppNVar11 = (this->rank_to_node_).
             super__Vector_base<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_>._M_impl.
             super__Vector_impl_data._M_start;
  pNVar9 = ppNVar11[rank];
  ppEVar3 = *(pointer *)
             ((long)&(pNVar9->outedges).
                     super__Vector_base<spoa::Graph::Edge_*,_std::allocator<spoa::Graph::Edge_*>_>.
                     _M_impl + 8);
  for (ppEVar12 = (pNVar9->outedges).
                  super__Vector_base<spoa::Graph::Edge_*,_std::allocator<spoa::Graph::Edge_*>_>.
                  _M_impl.super__Vector_impl_data._M_start; ppEVar12 != ppEVar3;
      ppEVar12 = ppEVar12 + 1) {
    ppEVar4 = *(pointer *)
               ((long)&((*ppEVar12)->head->inedges).
                       super__Vector_base<spoa::Graph::Edge_*,_std::allocator<spoa::Graph::Edge_*>_>
                       ._M_impl + 8);
    for (ppEVar13 = ((*ppEVar12)->head->inedges).
                    super__Vector_base<spoa::Graph::Edge_*,_std::allocator<spoa::Graph::Edge_*>_>.
                    _M_impl.super__Vector_impl_data._M_start; ppEVar13 != ppEVar4;
        ppEVar13 = ppEVar13 + 1) {
      if ((*ppEVar13)->tail != pNVar9) {
        (scores->super__Vector_base<long,_std::allocator<long>_>)._M_impl.super__Vector_impl_data.
        _M_start[(*ppEVar13)->tail->id] = -1;
      }
    }
  }
  pNVar9 = (Node *)0x0;
  do {
    uVar10 = (ulong)((int)uVar10 + 1);
    if ((ulong)((long)(this->rank_to_node_).
                      super__Vector_base<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_>.
                      _M_impl.super__Vector_impl_data._M_finish - (long)ppNVar11 >> 3) <= uVar10) {
      return pNVar9;
    }
    pNVar5 = ppNVar11[uVar10];
    uVar2 = pNVar5->id;
    (scores->super__Vector_base<long,_std::allocator<long>_>)._M_impl.super__Vector_impl_data.
    _M_start[uVar2] = -1;
    (predecessors->super__Vector_base<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_>).
    _M_impl.super__Vector_impl_data._M_start[uVar2] = (Node *)0x0;
    ppEVar3 = (pNVar5->inedges).
              super__Vector_base<spoa::Graph::Edge_*,_std::allocator<spoa::Graph::Edge_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
    for (ppEVar12 = (pNVar5->inedges).
                    super__Vector_base<spoa::Graph::Edge_*,_std::allocator<spoa::Graph::Edge_*>_>.
                    _M_impl.super__Vector_impl_data._M_start; ppEVar12 != ppEVar3;
        ppEVar12 = ppEVar12 + 1) {
      plVar6 = (scores->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
               super__Vector_impl_data._M_start;
      pNVar7 = (*ppEVar12)->tail;
      if (plVar6[pNVar7->id] != -1) {
        lVar8 = (*ppEVar12)->weight;
        if (plVar6[uVar2] < lVar8) {
          ppNVar11 = (predecessors->
                     super__Vector_base<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_>).
                     _M_impl.super__Vector_impl_data._M_start;
        }
        else if ((plVar6[uVar2] != lVar8) ||
                (ppNVar11 = (predecessors->
                            super__Vector_base<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_>
                            )._M_impl.super__Vector_impl_data._M_start,
                plVar6[pNVar7->id] < plVar6[ppNVar11[uVar2]->id])) goto LAB_00111ece;
        plVar6[uVar2] = lVar8;
        ppNVar11[uVar2] = pNVar7;
      }
LAB_00111ece:
    }
    pNVar7 = (predecessors->
             super__Vector_base<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_>)._M_impl.
             super__Vector_impl_data._M_start[uVar2];
    if (pNVar7 != (Node *)0x0) {
      plVar6 = (scores->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
               super__Vector_impl_data._M_start;
      plVar1 = plVar6 + uVar2;
      *plVar1 = *plVar1 + plVar6[pNVar7->id];
    }
    if ((pNVar9 == (Node *)0x0) ||
       (plVar6 = (scores->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
                 super__Vector_impl_data._M_start, plVar6[pNVar9->id] < plVar6[uVar2])) {
      pNVar9 = pNVar5;
    }
    ppNVar11 = (this->rank_to_node_).
               super__Vector_base<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_>._M_impl
               .super__Vector_impl_data._M_start;
  } while( true );
}

Assistant:

Graph::Node* Graph::BranchCompletion(
    std::uint32_t rank,
    std::vector<std::int64_t>* scores,
    std::vector<Node*>* predecessors) {
  auto start = rank_to_node_[rank];
  for (const auto& it : start->outedges) {
    for (const auto& jt : it->head->inedges) {
      if (jt->tail != start) {
        (*scores)[jt->tail->id] = -1;
      }
    }
  }

  Node* max = nullptr;
  for (std::uint32_t i = rank + 1; i < rank_to_node_.size(); ++i) {
    auto it = rank_to_node_[i];
    (*scores)[it->id] = -1;
    (*predecessors)[it->id] = nullptr;

    for (const auto& jt : it->inedges) {
      if ((*scores)[jt->tail->id] == -1) {
        continue;
      }
      if (((*scores)[it->id] < jt->weight) ||
          ((*scores)[it->id] == jt->weight && (*scores)[(*predecessors)[it->id]->id] <= (*scores)[jt->tail->id])) {  // NOLINT
        (*scores)[it->id] = jt->weight;
        (*predecessors)[it->id] = jt->tail;
      }
    }
    if ((*predecessors)[it->id]) {
      (*scores)[it->id] += (*scores)[(*predecessors)[it->id]->id];
    }
    if (!max || (*scores)[max->id] < (*scores)[it->id]) {
      max = it;
    }
  }

  return max;
}